

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O1

IAnimatedMesh * __thiscall
irr::scene::CXMeshFileLoader::createMesh(CXMeshFileLoader *this,IReadFile *file)

{
  int *piVar1;
  long *plVar2;
  long lVar3;
  void *pvVar4;
  SXMesh *this_00;
  pointer ppSVar5;
  bool bVar6;
  CSkinnedMesh *this_01;
  pointer ppSVar7;
  ulong uVar8;
  
  if (file != (IReadFile *)0x0) {
    this_01 = (CSkinnedMesh *)operator_new(0xd8);
    CSkinnedMesh::CSkinnedMesh(this_01);
    *(CSkinnedMesh **)&(this->super_IMeshLoader).field_0x8 = this_01;
    bVar6 = load(this,file);
    plVar2 = *(long **)&(this->super_IMeshLoader).field_0x8;
    if (bVar6) {
      (**(code **)(*plVar2 + 0xe8))();
    }
    else {
      lVar3 = *(long *)(*plVar2 + -0x18);
      piVar1 = (int *)((long)plVar2 + lVar3 + 0x10);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (**(code **)(*(long *)((long)plVar2 + lVar3) + 8))();
      }
      *(undefined8 *)&(this->super_IMeshLoader).field_0x8 = 0;
    }
    this->CurFrame = (SJoint *)0x0;
    *(undefined8 *)&(this->super_IMeshLoader).field_0x18 = 0;
    this->End = (c8 *)0x0;
    this->BinaryNumCount = 0;
    this->MajorVersion = 0;
    this->MinorVersion = 0;
    this->BinaryFormat = false;
    this->FloatSize = '\0';
    pvVar4 = *(void **)&(this->super_IMeshLoader).field_0x10;
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
    *(undefined8 *)&(this->super_IMeshLoader).field_0x10 = 0;
    ppSVar7 = (this->Meshes).m_data.
              super__Vector_base<irr::scene::CXMeshFileLoader::SXMesh_*,_std::allocator<irr::scene::CXMeshFileLoader::SXMesh_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->Meshes).m_data.
                            super__Vector_base<irr::scene::CXMeshFileLoader::SXMesh_*,_std::allocator<irr::scene::CXMeshFileLoader::SXMesh_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7) >> 3) != 0)
    {
      uVar8 = 0;
      do {
        this_00 = ppSVar7[uVar8];
        if (this_00 != (SXMesh *)0x0) {
          SXMesh::~SXMesh(this_00);
          operator_delete(this_00,0x158);
        }
        uVar8 = uVar8 + 1;
        ppSVar7 = (this->Meshes).m_data.
                  super__Vector_base<irr::scene::CXMeshFileLoader::SXMesh_*,_std::allocator<irr::scene::CXMeshFileLoader::SXMesh_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar8 < ((ulong)((long)(this->Meshes).m_data.
                                      super__Vector_base<irr::scene::CXMeshFileLoader::SXMesh_*,_std::allocator<irr::scene::CXMeshFileLoader::SXMesh_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7) >>
                        3 & 0xffffffff));
    }
    ppSVar5 = (this->Meshes).m_data.
              super__Vector_base<irr::scene::CXMeshFileLoader::SXMesh_*,_std::allocator<irr::scene::CXMeshFileLoader::SXMesh_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->Meshes).m_data.
    super__Vector_base<irr::scene::CXMeshFileLoader::SXMesh_*,_std::allocator<irr::scene::CXMeshFileLoader::SXMesh_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->Meshes).m_data.
    super__Vector_base<irr::scene::CXMeshFileLoader::SXMesh_*,_std::allocator<irr::scene::CXMeshFileLoader::SXMesh_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->Meshes).m_data.
    super__Vector_base<irr::scene::CXMeshFileLoader::SXMesh_*,_std::allocator<irr::scene::CXMeshFileLoader::SXMesh_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppSVar7 != (pointer)0x0) {
      operator_delete(ppSVar7,(long)ppSVar5 - (long)ppSVar7);
    }
    (this->Meshes).is_sorted = true;
    return *(IAnimatedMesh **)&(this->super_IMeshLoader).field_0x8;
  }
  return (IAnimatedMesh *)0x0;
}

Assistant:

IAnimatedMesh *CXMeshFileLoader::createMesh(io::IReadFile *file)
{
	if (!file)
		return 0;

#ifdef _XREADER_DEBUG
	u32 time = os::Timer::getRealTime();
#endif

	AnimatedMesh = new CSkinnedMesh();

	if (load(file)) {
		AnimatedMesh->finalize();
	} else {
		AnimatedMesh->drop();
		AnimatedMesh = 0;
	}
#ifdef _XREADER_DEBUG
	time = os::Timer::getRealTime() - time;
	core::stringc tmpString = "Time to load ";
	tmpString += BinaryFormat ? "binary" : "ascii";
	tmpString += " X file: ";
	tmpString += time;
	tmpString += "ms";
	os::Printer::log(tmpString.c_str());
#endif
	// Clear up

	MajorVersion = 0;
	MinorVersion = 0;
	BinaryFormat = 0;
	BinaryNumCount = 0;
	FloatSize = 0;
	P = 0;
	End = 0;
	CurFrame = 0;

	delete[] Buffer;
	Buffer = 0;

	for (u32 i = 0; i < Meshes.size(); ++i)
		delete Meshes[i];
	Meshes.clear();

	return AnimatedMesh;
}